

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O3

ssize_t __thiscall
bitio::bitio_stream::read(bitio_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  uint64_t uVar2;
  ulong uVar3;
  sbyte sVar4;
  byte bVar5;
  uchar *__ptr;
  char cVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  
  if (__fd != 0) {
    bVar7 = (byte)__fd;
    bVar9 = this->bit_count;
    if (bVar9 == 0) {
      if (this->eof == true) {
        this->bit_buffer = '\0';
      }
      uVar2 = this->byte_index;
      if (uVar2 == this->current_buffer_length) {
        sVar1 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
        bVar8 = sVar1 == 0;
        if (bVar8) {
          sVar1 = this->current_buffer_length;
        }
        this->current_buffer_length = sVar1;
        this->eof = bVar8;
        uVar2 = 0;
      }
      this->byte_index = uVar2 + 1;
      this->bit_buffer = this->byte_buffer[uVar2];
      bVar9 = 8;
    }
    bVar5 = bVar9 - bVar7;
    if (bVar9 < bVar7) {
      uVar3 = (ulong)(this->bit_buffer >> (8 - bVar9 & 0x1f));
      bVar7 = bVar7 - bVar9;
      this->bit_buffer = '\0';
      this->bit_count = '\0';
      if (bVar7 < 8) {
        bVar9 = this->eof;
      }
      else {
        cVar6 = (char)bVar7 >> 3;
        bVar9 = this->eof;
        do {
          if ((bVar9 & 1) != 0) {
            this->bit_buffer = '\0';
          }
          __ptr = this->byte_buffer;
          uVar2 = this->byte_index;
          if (uVar2 == this->current_buffer_length) {
            sVar1 = fread(__ptr,1,this->buffer_size,(FILE *)this->file);
            bVar9 = sVar1 == 0;
            if ((bool)bVar9) {
              sVar1 = this->current_buffer_length;
            }
            this->current_buffer_length = sVar1;
            this->eof = (bool)bVar9;
            __ptr = this->byte_buffer;
            uVar2 = 0;
          }
          cVar6 = cVar6 + -1;
          this->byte_index = uVar2 + 1;
          bVar5 = __ptr[uVar2];
          this->bit_buffer = bVar5;
          uVar3 = uVar3 << 8 | (ulong)bVar5;
        } while (cVar6 != '\0');
      }
      if ((bVar9 & 1) != 0) {
        this->bit_buffer = '\0';
      }
      uVar2 = this->byte_index;
      if (uVar2 == this->current_buffer_length) {
        sVar1 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
        bVar8 = sVar1 == 0;
        if (bVar8) {
          sVar1 = this->current_buffer_length;
        }
        this->current_buffer_length = sVar1;
        this->eof = bVar8;
        uVar2 = 0;
      }
      sVar4 = (sbyte)(bVar7 & 7);
      this->byte_index = uVar2 + 1;
      bVar5 = 8 - sVar4;
      uVar3 = (ulong)(byte)((reverse_bit_masks[bVar7 & 7] & this->byte_buffer[uVar2]) >>
                           (bVar5 & 0x1f)) + (uVar3 << sVar4);
      this->bit_buffer = this->byte_buffer[uVar2] << sVar4;
    }
    else {
      uVar3 = (ulong)(byte)((reverse_bit_masks[(ulong)(uint)__fd & 0xff] & this->bit_buffer) >>
                           (8 - bVar7 & 0x1f));
      this->bit_buffer = this->bit_buffer << (bVar7 & 0x1f);
    }
    this->bit_count = bVar5;
    return uVar3 & *(ulong *)(ui64_masks + ((ulong)(uint)__fd & 0xff) * 8);
  }
  return 0;
}

Assistant:

uint64_t bitio_stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    if (bit_count == 0) {
        load_byte();
        bit_count = 8;
    }

    if (bit_count >= n) {
        value += (bit_buffer & reverse_bit_masks[n]) >> (8 - n);
        bit_buffer <<= n;
        bit_count -= n;
    } else {
        value += bit_buffer >> (8 - bit_count);
        char target_bits = n - bit_count;
        char nbytes = target_bits >> 3;
        bit_buffer = 0;
        bit_count = 0;

        while (nbytes--) {
            load_byte();
            value <<= 8;
            value += bit_buffer;
        }
        load_byte();
        bit_count = 8;

        char rembits = target_bits & bit_masks[3];

        value <<= rembits;
        value += (bit_buffer & reverse_bit_masks[rembits]) >> (8 - rembits);
        bit_buffer <<= rembits;
        bit_count -= rembits;
    }
    return value & ui64_masks[n];
}